

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TilePool.test.cpp
# Opt level: O2

TileData *
setTileInPool<tiles::Input>
          (TileData *__return_storage_ptr__,TilePool *pool,size_t sectorId,uint offset,
          TileData expected,Input *tileType,t tileId)

{
  TileData *pTVar1;
  uint offset_00;
  Tile *this;
  t tileId_local;
  TileData expected_local;
  TileType local_f0;
  undefined4 local_e4;
  Tile local_e0;
  BinaryExpr<const_TileData_&,_const_TileData_&> local_c8;
  AssertionHandler catchAssertionHandler;
  StringRef local_50;
  StringRef local_40;
  
  local_c8.super_ITransientExpression._vptr_ITransientExpression = (_func_int **)0x1f6033;
  local_c8.super_ITransientExpression.m_isBinaryExpression = true;
  local_c8.super_ITransientExpression.m_result = false;
  local_c8.super_ITransientExpression._10_6_ = 0;
  local_e0.tileType_ = (TileType *)0x1f8ecc;
  local_e0.chunk_ = (Chunk *)0x16;
  tileId_local = tileId;
  expected_local = (TileData)offset;
  Catch::StringRef::StringRef
            (&local_40,"pool.accessTile(sectorId, offset).getRawData() == expected");
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,(StringRef *)&local_c8,(SourceLineInfo *)&local_e0,local_40,
             Normal);
  offset_00 = (uint)sectorId;
  this = (Tile *)__return_storage_ptr__;
  TilePool::accessTile(&local_e0,(TilePool *)__return_storage_ptr__,(size_t)pool,offset_00);
  pTVar1 = Tile::getRawData((TileData *)&local_e0,this);
  local_f0._vptr_TileType = (_func_int **)&local_e4;
  local_e4 = SUB84(pTVar1,0);
  Catch::ExprLhs<TileData_const&>::operator==
            (&local_c8,(ExprLhs<TileData_const&> *)&local_f0,&expected_local);
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,&local_c8.super_ITransientExpression);
  Catch::ITransientExpression::~ITransientExpression(&local_c8.super_ITransientExpression);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  TilePool::accessTile
            ((Tile *)&catchAssertionHandler,(TilePool *)__return_storage_ptr__,(size_t)pool,
             offset_00);
  Tile::setType((Tile *)&catchAssertionHandler,tileType,tileId_local,low,' ');
  TilePool::accessTile
            ((Tile *)&catchAssertionHandler,(TilePool *)__return_storage_ptr__,(size_t)pool,
             offset_00);
  pTVar1 = Tile::getRawData((TileData *)&catchAssertionHandler,(Tile *)__return_storage_ptr__);
  local_c8.super_ITransientExpression._vptr_ITransientExpression = (_func_int **)0x1f6033;
  local_c8.super_ITransientExpression.m_isBinaryExpression = true;
  local_c8.super_ITransientExpression.m_result = false;
  local_c8.super_ITransientExpression._10_6_ = 0;
  local_e0.tileType_ = (TileType *)0x1f8ecc;
  local_e0.chunk_ = (Chunk *)0x19;
  Catch::StringRef::StringRef(&local_50,"result.id == tileId");
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,(StringRef *)&local_c8,(SourceLineInfo *)&local_e0,local_50,
             Normal);
  local_e0.tileType_ = &local_f0;
  local_f0._vptr_TileType =
       (_func_int **)(CONCAT71(local_f0._vptr_TileType._1_7_,(char)pTVar1) & 0xffffffffffffff1f);
  Catch::ExprLhs<TileId::t_const&>::operator==
            ((BinaryExpr<const_TileId::t_&,_const_TileId::t_&> *)&local_c8,
             (ExprLhs<TileId::t_const&> *)&local_e0,&tileId_local);
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,&local_c8.super_ITransientExpression);
  Catch::ITransientExpression::~ITransientExpression(&local_c8.super_ITransientExpression);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  return (TileData *)((ulong)pTVar1 & 0xffffffff);
}

Assistant:

TileData setTileInPool(TilePool& pool, size_t sectorId, unsigned int offset, TileData expected, T* tileType, TileId::t tileId) {
    REQUIRE(pool.accessTile(sectorId, offset).getRawData() == expected);
    pool.accessTile(sectorId, offset).setType(tileType, tileId);
    TileData result = pool.accessTile(sectorId, offset).getRawData();
    REQUIRE(result.id == tileId);
    return result;
}